

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

void __thiscall
nlohmann::
basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>
::basic_json(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>
             *this,initializer_list<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>_>
                   init,bool type_deduction,value_t manual_type)

{
  map<std::__cxx11::string,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator>>>>
  *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args;
  bool bVar1;
  size_type sVar2;
  domain_error *this_01;
  const_iterator pbVar3;
  const_reference pvVar4;
  object_t *poVar5;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>
  *element_1;
  const_iterator __end0_1;
  const_iterator __begin0_1;
  initializer_list<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>_>
  *__range3;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>
  *local_48;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>
  *element;
  const_iterator __end0;
  const_iterator __begin0;
  initializer_list<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>_>
  *__range2;
  bool is_an_object;
  value_t manual_type_local;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>
  *pbStack_20;
  bool type_deduction_local;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>
  *this_local;
  initializer_list<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>_>
  init_local;
  
  init_local._M_array = (iterator)init._M_len;
  this_local = init._M_array;
  __range2._6_1_ = manual_type;
  __range2._7_1_ = type_deduction;
  pbStack_20 = this;
  type_data_t::type_data_t((type_data_t *)this,null);
  memset(&this->m_value,0,8);
  __range2._5_1_ = 1;
  __begin0 = (const_iterator)&this_local;
  __end0 = std::
           initializer_list<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>_>
           ::begin((initializer_list<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>_>
                    *)__begin0);
  element = std::
            initializer_list<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>_>
            ::end((initializer_list<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>_>
                   *)__begin0);
  do {
    if (__end0 == element) {
LAB_00107011:
      if ((__range2._7_1_ & 1) == 0) {
        if (__range2._6_1_ == array) {
          __range2._5_1_ = 0;
        }
        if ((__range2._6_1_ == object) && ((__range2._5_1_ & 1) == 0)) {
          this_01 = (domain_error *)__cxa_allocate_exception(0x10);
          std::domain_error::domain_error(this_01,"cannot create object from initializer list");
          __cxa_throw(this_01,&std::domain_error::typeinfo,std::domain_error::~domain_error);
        }
      }
      if ((__range2._5_1_ & 1) == 0) {
        type_data_t::operator=((type_data_t *)this,array);
        poVar5 = (object_t *)
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator>
                 ::
                 create<std::vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator>>>,std::initializer_list<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator>>&>
                           ((initializer_list<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>_>
                             *)&this_local);
        (this->m_value).object = poVar5;
      }
      else {
        type_data_t::operator=((type_data_t *)this,object);
        json_value::json_value((json_value *)&__range3,object);
        (this->m_value).object = (object_t *)__range3;
        if ((this->m_value).object == (object_t *)0x0) {
          __assert_fail("m_value.object != nullptr",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/alican[P]GeneticAlgorithm/algorithm/../lib/json.hpp"
                        ,0x67c,
                        "nlohmann::basic_json<>::basic_json(std::initializer_list<basic_json<ObjectType, ArrayType, StringType, BooleanType, NumberIntegerType, NumberUnsignedType, NumberFloatType, AllocatorType>>, bool, value_t) [ObjectType = std::map, ArrayType = std::vector, StringType = std::basic_string<char>, BooleanType = bool, NumberIntegerType = long, NumberUnsignedType = unsigned long, NumberFloatType = double, AllocatorType = std::allocator]"
                       );
        }
        __end0_1 = std::
                   initializer_list<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>_>
                   ::begin((initializer_list<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>_>
                            *)&this_local);
        pbVar3 = std::
                 initializer_list<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>_>
                 ::end((initializer_list<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>_>
                        *)&this_local);
        for (; __end0_1 != pbVar3; __end0_1 = __end0_1 + 1) {
          this_00 = (map<std::__cxx11::string,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator>>>>
                     *)(this->m_value).object;
          pvVar4 = operator[](__end0_1,0);
          __args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (pvVar4->m_value).object;
          pvVar4 = operator[](__end0_1,1);
          std::
          map<std::__cxx11::string,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator>>>>
          ::
          emplace<std::__cxx11::string&,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator>const&>
                    (this_00,__args,pvVar4);
        }
      }
      return;
    }
    local_48 = __end0;
    bVar1 = is_array(__end0);
    if ((!bVar1) || (sVar2 = size(local_48), sVar2 != 2)) {
LAB_00106ffb:
      __range2._5_1_ = 0;
      goto LAB_00107011;
    }
    pvVar4 = operator[](local_48,0);
    bVar1 = is_string(pvVar4);
    if (!bVar1) goto LAB_00106ffb;
    __end0 = __end0 + 1;
  } while( true );
}

Assistant:

basic_json(std::initializer_list<basic_json> init,
                   bool type_deduction = true,
                   value_t manual_type = value_t::array)
        {
            // the initializer list could describe an object
            bool is_an_object = true;

            // check if each element is an array with two elements whose first
            // element is a string
            for (const auto& element : init)
            {
                if (not element.is_array() or element.size() != 2
                    or not element[0].is_string())
                {
                    // we found an element that makes it impossible to use the
                    // initializer list as object
                    is_an_object = false;
                    break;
                }
            }

            // adjust type if type deduction is not wanted
            if (not type_deduction)
            {
                // if array is wanted, do not create an object though possible
                if (manual_type == value_t::array)
                {
                    is_an_object = false;
                }

                // if object is wanted but impossible, throw an exception
                if (manual_type == value_t::object and not is_an_object)
                {
                    throw std::domain_error("cannot create object from initializer list");
                }
            }

            if (is_an_object)
            {
                // the initializer list is a list of pairs -> create object
                m_type = value_t::object;
                m_value = value_t::object;

                assert(m_value.object != nullptr);

                for (auto& element : init)
                {
                    m_value.object->emplace(*(element[0].m_value.string), element[1]);
                }
            }
            else
            {
                // the initializer list describes an array -> create array
                m_type = value_t::array;
                m_value.array = create<array_t>(init);
            }
        }